

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int session_on_data_received_fail_fast(nghttp2_session *session)

{
  nghttp2_map_key_type key;
  int iVar1;
  int iVar2;
  void *pvVar3;
  char *reason;
  uint32_t error_code;
  
  key = (session->iframe).frame.hd.stream_id;
  error_code = 1;
  if (key == 0) {
    reason = "DATA: stream_id == 0";
  }
  else {
    if ((session->server == '\0') == (bool)((byte)key & 1)) {
      iVar2 = session->last_sent_stream_id;
    }
    else {
      iVar2 = session->last_recv_stream_id;
    }
    if (iVar2 < key) {
      reason = "DATA: stream in idle";
    }
    else {
      pvVar3 = nghttp2_map_find(&session->streams,key);
      if (((pvVar3 == (void *)0x0) || ((*(byte *)((long)pvVar3 + 0xd8) & 2) != 0)) ||
         (iVar2 = *(int *)((long)pvVar3 + 0xcc), iVar2 == 5)) {
        pvVar3 = nghttp2_map_find(&session->streams,key);
        if (pvVar3 == (void *)0x0) {
          return -0x68;
        }
        if ((*(byte *)((long)pvVar3 + 0xd9) & 1) == 0) {
          return -0x68;
        }
        error_code = 5;
        reason = "DATA: stream closed";
      }
      else if ((*(byte *)((long)pvVar3 + 0xd9) & 1) == 0) {
        if (((session->server == '\0' ^ (byte)key) & 1) == 0) {
          if (iVar2 == 3) {
            return -0x68;
          }
          if (iVar2 == 2) {
            return 0;
          }
          reason = "DATA: stream not opened";
        }
        else {
          if (iVar2 == 3) {
            return -0x68;
          }
          if (iVar2 != 4) {
            return 0;
          }
          reason = "DATA: stream in reserved";
        }
      }
      else {
        error_code = 5;
        reason = "DATA: stream in half-closed(remote)";
      }
    }
  }
  iVar1 = session_terminate_session(session,session->last_proc_stream_id,error_code,reason);
  iVar2 = -0x68;
  if (iVar1 < -900) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

static int session_on_data_received_fail_fast(nghttp2_session *session) {
  int rv;
  nghttp2_stream *stream;
  nghttp2_inbound_frame *iframe;
  int32_t stream_id;
  const char *failure_reason;
  uint32_t error_code = NGHTTP2_PROTOCOL_ERROR;

  iframe = &session->iframe;
  stream_id = iframe->frame.hd.stream_id;

  if (stream_id == 0) {
    /* The spec says that if a DATA frame is received whose stream ID
       is 0, the recipient MUST respond with a connection error of
       type PROTOCOL_ERROR. */
    failure_reason = "DATA: stream_id == 0";
    goto fail;
  }

  if (session_detect_idle_stream(session, stream_id)) {
    failure_reason = "DATA: stream in idle";
    error_code = NGHTTP2_PROTOCOL_ERROR;
    goto fail;
  }

  stream = nghttp2_session_get_stream(session, stream_id);
  if (!stream) {
    stream = nghttp2_session_get_stream_raw(session, stream_id);
    if (stream && (stream->shut_flags & NGHTTP2_SHUT_RD)) {
      failure_reason = "DATA: stream closed";
      error_code = NGHTTP2_STREAM_CLOSED;
      goto fail;
    }

    return NGHTTP2_ERR_IGN_PAYLOAD;
  }
  if (stream->shut_flags & NGHTTP2_SHUT_RD) {
    failure_reason = "DATA: stream in half-closed(remote)";
    error_code = NGHTTP2_STREAM_CLOSED;
    goto fail;
  }

  if (nghttp2_session_is_my_stream_id(session, stream_id)) {
    if (stream->state == NGHTTP2_STREAM_CLOSING) {
      return NGHTTP2_ERR_IGN_PAYLOAD;
    }
    if (stream->state != NGHTTP2_STREAM_OPENED) {
      failure_reason = "DATA: stream not opened";
      goto fail;
    }
    return 0;
  }
  if (stream->state == NGHTTP2_STREAM_RESERVED) {
    failure_reason = "DATA: stream in reserved";
    goto fail;
  }
  if (stream->state == NGHTTP2_STREAM_CLOSING) {
    return NGHTTP2_ERR_IGN_PAYLOAD;
  }
  return 0;
fail:
  rv = nghttp2_session_terminate_session_with_reason(session, error_code,
                                                     failure_reason);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }
  return NGHTTP2_ERR_IGN_PAYLOAD;
}